

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cc
# Opt level: O3

void __thiscall Minisat::Solver::reset_old_trail(Solver *this)

{
  Lit *pLVar1;
  uint *puVar2;
  long lVar3;
  
  pLVar1 = (this->old_trail).data;
  if ((this->old_trail).sz < 1) {
    if (pLVar1 == (Lit *)0x0) goto LAB_00114564;
  }
  else {
    puVar2 = (this->oldreasons).data;
    lVar3 = 0;
    do {
      puVar2[pLVar1[lVar3].x >> 1] = 0xffffffff;
      lVar3 = lVar3 + 1;
    } while (lVar3 < (this->old_trail).sz);
  }
  (this->old_trail).sz = 0;
LAB_00114564:
  this->old_trail_qhead = 0;
  return;
}

Assistant:

void Solver::reset_old_trail()
{
    TRACE(std::cout << "c reset old trail" << std::endl);
    for (int i = 0; i < old_trail.size(); i++) {
        oldreasons[var(old_trail[i])] = CRef_Undef;
    }
    old_trail.clear();
    old_trail_qhead = 0;
}